

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O3

void TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::main(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  TPZVec<long> DestInd3;
  TPZVec<long> DestInd2;
  TPZVec<long> DestInd1;
  TPZVec<int> NumConnected;
  TPZFMatrix<double> KEl1;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> TestFront;
  TPZFMatrix<double> TStack_1fdd8;
  _func_int **pp_Stack_1fd48;
  _func_int **pp_Stack_1fd40;
  double dStack_1fd38;
  TPZVec<long> TStack_1fd30;
  TPZVec<long> TStack_1fd10;
  TPZVec<long> TStack_1fcf0;
  TPZVec<int> TStack_1fcd0;
  TPZFMatrix<double> TStack_1fcb0;
  TPZFMatrix<double> TStack_1fc20;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> TStack_1fb90;
  
  TStack_1fcb0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  TStack_1fcb0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  TStack_1fcb0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  TStack_1fcb0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  TStack_1fcb0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  TStack_1fcb0.fElem = (double *)0x0;
  TStack_1fcb0.fGiven = (double *)0x0;
  TStack_1fcb0.fSize = 0;
  TPZVec<int>::TPZVec(&TStack_1fcb0.fPivot.super_TPZVec<int>,0);
  TStack_1fcb0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  TStack_1fcb0.fPivot.super_TPZVec<int>.fStore = TStack_1fcb0.fPivot.fExtAlloc;
  TStack_1fcb0.fPivot.super_TPZVec<int>.fNElements = 0;
  TStack_1fcb0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  TStack_1fcb0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  TStack_1fcb0.fWork.fStore = (double *)0x0;
  TStack_1fcb0.fWork.fNElements = 0;
  TStack_1fcb0.fWork.fNAlloc = 0;
  TStack_1fcb0.fElem = (double *)operator_new__(0x20);
  if ((TStack_1fcb0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (TStack_1fcb0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *TStack_1fcb0.fElem = 4.0;
  if (TStack_1fcb0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_1fcb0.fElem[TStack_1fcb0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow] = 6.0;
  if ((TStack_1fcb0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
     (TStack_1fcb0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_1fcb0.fElem[1] = 6.0;
  if ((TStack_1fcb0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
     (TStack_1fcb0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_1fcb0.fElem[TStack_1fcb0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1] = 12.0;
  TPZVec<long>::TPZVec(&TStack_1fcf0,2);
  *TStack_1fcf0.fStore = 0;
  TStack_1fcf0.fStore[1] = 1;
  TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 4;
  TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 4;
  TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  TStack_1fdd8.fElem = (double *)0x0;
  TStack_1fdd8.fGiven = (double *)0x0;
  TStack_1fdd8.fSize = 0;
  TPZVec<int>::TPZVec(&TStack_1fdd8.fPivot.super_TPZVec<int>,0);
  TStack_1fdd8.fPivot.super_TPZVec<int>.fStore = TStack_1fdd8.fPivot.fExtAlloc;
  TStack_1fdd8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  TStack_1fdd8.fPivot.super_TPZVec<int>.fNElements = 0;
  TStack_1fdd8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  TStack_1fdd8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  TStack_1fdd8.fWork.fStore = (double *)0x0;
  TStack_1fdd8.fWork.fNElements = 0;
  TStack_1fdd8.fWork.fNAlloc = 0;
  TStack_1fdd8.fElem = (double *)operator_new__(0x80);
  if ((TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *TStack_1fdd8.fElem = 4.0;
  if (TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_1fdd8.fElem[TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow] = -6.0;
  if ((TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_1fdd8.fElem[TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2] = 2.0;
  if ((TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 4)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_1fdd8.fElem[TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 3] = 6.0;
  if ((TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
     (TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_1fdd8.fElem[TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1] = 12.0;
  if ((TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
     (TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_1fdd8.fElem[TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2 + 1] = -6.0;
  if ((TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
     (TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 4)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_1fdd8.fElem[TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 3 + 1] = -12.0;
  if ((TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 3) ||
     (TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_1fdd8.fElem[TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2 + 2] = 4.0;
  if ((2 < TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) &&
     (3 < TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol)) {
    TStack_1fdd8.fElem[TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 3 + 2] = 6.0;
    if ((TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 4) ||
       (TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pp_Stack_1fd48 = (_func_int **)&PTR__TPZManVector_01815498;
    pp_Stack_1fd40 = (_func_int **)&PTR__TPZFMatrix_018151d8;
    TStack_1fdd8.fElem[TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 3 + 3] = 12.0
    ;
    lVar1 = 0;
    lVar2 = 0;
    lVar3 = lVar2;
    do {
      do {
        if (TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar2 ||
            TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar3) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dStack_1fd38 = TStack_1fdd8.fElem
                       [TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar2 +
                        lVar3];
        if ((TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar2) ||
           (TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(double *)
         ((long)TStack_1fdd8.fElem +
         lVar2 * 8 + lVar1 * TStack_1fdd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) =
             dStack_1fd38;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      lVar2 = lVar3 + 1;
      lVar1 = lVar1 + 8;
      lVar3 = lVar2;
    } while (lVar2 != 4);
    TPZVec<long>::TPZVec(&TStack_1fd10,4);
    *TStack_1fd10.fStore = 0;
    TStack_1fd10.fStore[1] = 1;
    TStack_1fd10.fStore[2] = 2;
    TStack_1fd10.fStore[3] = 3;
    TStack_1fc20.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
    TStack_1fc20.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
    TStack_1fc20.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    TStack_1fc20.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    TStack_1fc20.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         pp_Stack_1fd40;
    TStack_1fc20.fElem = (double *)0x0;
    TStack_1fc20.fGiven = (double *)0x0;
    TStack_1fc20.fSize = 0;
    TPZVec<int>::TPZVec(&TStack_1fc20.fPivot.super_TPZVec<int>,0);
    TStack_1fc20.fPivot.super_TPZVec<int>.fStore = TStack_1fc20.fPivot.fExtAlloc;
    TStack_1fc20.fPivot.super_TPZVec<int>._vptr_TPZVec = pp_Stack_1fd48;
    TStack_1fc20.fPivot.super_TPZVec<int>.fNElements = 0;
    TStack_1fc20.fPivot.super_TPZVec<int>.fNAlloc = 0;
    TStack_1fc20.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    TStack_1fc20.fWork.fStore = (double *)0x0;
    TStack_1fc20.fWork.fNElements = 0;
    TStack_1fc20.fWork.fNAlloc = 0;
    TStack_1fc20.fElem = (double *)operator_new__(0x20);
    if ((TStack_1fc20.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
       (TStack_1fc20.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    *TStack_1fc20.fElem = 3.0;
    if (TStack_1fc20.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    TStack_1fc20.fElem[TStack_1fc20.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow] = 3.0;
    if ((1 < TStack_1fcb0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) &&
       (0 < TStack_1fcb0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol)) {
      TStack_1fcb0.fElem[1] = 3.0;
      if ((1 < TStack_1fc20.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) &&
         (1 < TStack_1fc20.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol)) {
        TStack_1fc20.fElem[TStack_1fc20.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1] = 6.0;
        TPZVec<long>::TPZVec(&TStack_1fd30,2);
        *TStack_1fd30.fStore = 2;
        TStack_1fd30.fStore[1] = 3;
        TPZFrontMatrix(&TStack_1fb90,4);
        TPZVec<int>::TPZVec(&TStack_1fcd0,4);
        TStack_1fcd0.fStore[0] = 2;
        TStack_1fcd0.fStore[1] = 2;
        TStack_1fcd0.fStore[2] = 2;
        TStack_1fcd0.fStore[3] = 2;
        SetNumElConnected(&TStack_1fb90,&TStack_1fcd0);
        SymbolicAddKel(&TStack_1fb90,&TStack_1fcf0);
        SymbolicAddKel(&TStack_1fb90,&TStack_1fd10);
        SymbolicAddKel(&TStack_1fb90,&TStack_1fd30);
        TPZFrontNonSym<double>::AllocData(&TStack_1fb90.fFront);
        TStack_1fb90.fLastDecomposed = -1;
        SetNumElConnected(&TStack_1fb90,&TStack_1fcd0);
        AddKel(&TStack_1fb90,&TStack_1fcb0,&TStack_1fcf0);
        AddKel(&TStack_1fb90,&TStack_1fdd8,&TStack_1fd10);
        AddKel(&TStack_1fb90,&TStack_1fc20,&TStack_1fd30);
        TStack_1fcd0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
        if (TStack_1fcd0.fStore != (int *)0x0) {
          operator_delete__(TStack_1fcd0.fStore);
        }
        ~TPZFrontMatrix(&TStack_1fb90,
                        &TPZFrontMatrix<double,TPZStackEqnStorage<double>,TPZFrontNonSym<double>>::
                         VTT);
        TStack_1fd30._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
        if (TStack_1fd30.fStore != (long *)0x0) {
          operator_delete__(TStack_1fd30.fStore);
        }
        TPZFMatrix<double>::~TPZFMatrix(&TStack_1fc20);
        TStack_1fd10._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
        if (TStack_1fd10.fStore != (long *)0x0) {
          operator_delete__(TStack_1fd10.fStore);
        }
        TPZFMatrix<double>::~TPZFMatrix(&TStack_1fdd8);
        TStack_1fcf0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
        if (TStack_1fcf0.fStore != (long *)0x0) {
          operator_delete__(TStack_1fcf0.fStore);
        }
        TPZFMatrix<double>::~TPZFMatrix(&TStack_1fcb0);
        return;
      }
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::main()
{
	TPZFMatrix<TVar> KEl1(2,2);
	KEl1(0,0)=4.;
	KEl1(0,1)=6.;
	KEl1(1,0)=6.;
	KEl1(1,1)=12.;
	TPZVec<int64_t> DestInd1(2);
	DestInd1[0]=0;
	DestInd1[1]=1;
	
	
	TPZFMatrix<TVar> KEl2(4,4);
	KEl2(0,0)=4.;
	KEl2(0,1)=-6.;
	KEl2(0,2)=2.;
	KEl2(0,3)=6.;
	
	KEl2(1,1)=12;
	KEl2(1,2)=-6.;
	KEl2(1,3)=-12.;
	
	KEl2(2,2)=4.;
	KEl2(2,3)=6.;
	
	KEl2(3,3)=12.;
	
	int i, j;
	for(i=0;i<4;i++) {
		for(j=i;j<4;j++) KEl2(j,i)=KEl2(i,j);
	}
	
	TPZVec<int64_t> DestInd2(4);
	DestInd2[0]=0;
	DestInd2[1]=1;
	DestInd2[2]=2;
	DestInd2[3]=3;

	TPZFMatrix<TVar> KEl3(2,2);
	KEl3(0,0)=3.;
	KEl3(0,1)=3.;
	KEl1(1,0)=3.;
	KEl3(1,1)=6.;
	
	TPZVec<int64_t> DestInd3(2);
	DestInd3[0]=2;
	DestInd3[1]=3;

	TPZFrontMatrix TestFront(4);
	
	TPZVec<int> NumConnected(4);
	for(i=0;i<4;i++) NumConnected[i]=2;
	
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.SymbolicAddKel(DestInd1);
	TestFront.SymbolicAddKel(DestInd2);
	TestFront.SymbolicAddKel(DestInd3);
	
	TestFront.AllocData();
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.AddKel(KEl1,DestInd1);
	TestFront.AddKel(KEl2,DestInd2);
	TestFront.AddKel(KEl3,DestInd3);
}